

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution.hpp
# Opt level: O1

ostream * operator<<(ostream *out,
                    EquationSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>
                    *solution)

{
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *r;
  variant_alternative_t<1UL,_variant<vector<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_allocator<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>_>_>,_SpecificSolution>_>
  *spec;
  variant_alternative_t<0UL,_variant<vector<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_allocator<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>_>_>,_SpecificSolution>_>
  *pvVar1;
  ostream *poVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  if ((solution->
      super__Variant_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_SpecificSolution>
      ).
      super__Move_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
      .
      super__Copy_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
      .
      super__Move_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
      .
      super__Copy_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
      .
      super__Variant_storage_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
      ._M_index == '\0') {
    pvVar1 = std::
             get<0ul,std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>,SpecificSolution>
                       (solution);
    std::__ostream_insert<char,std::char_traits<char>>(out,"(",1);
    uVar3 = (int)((long)(pvVar1->
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar1->
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x33333333;
    if (1 < (int)uVar3) {
      uVar4 = (ulong)(uVar3 & 0x7fffffff);
      lVar5 = uVar4 + 1;
      lVar6 = uVar4 * 0x50;
      do {
        poVar2 = boost::multiprecision::operator<<
                           (out,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                                 *)((long)(pvVar1->
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                          data._M_elems + lVar6));
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
        lVar5 = lVar5 + -1;
        lVar6 = lVar6 + -0x50;
      } while (2 < lVar5);
    }
    r = (pvVar1->
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
    if (r != (pvVar1->
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
             )._M_impl.super__Vector_impl_data._M_finish) {
      boost::multiprecision::operator<<(out,r);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  }
  else {
    spec = std::
           get<1ul,std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>,SpecificSolution>
                     (solution);
    operator<<(out,spec);
  }
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const EquationSolution<ValueType> &solution) {
    std::size_t index = solution.index();
    if (index == 0) {
        const std::vector<ValueType> &vals = std::get<std::vector<ValueType> >(solution);
        out << "(";
        for (int i = int(vals.size()) - 1; i > 0; i--) {
            out << vals[i] << ", ";
        }
        //make sure that we don't have an extra ',' at the end
        if (!vals.empty()) {
            out << vals[0];
        }
        out << ")";
    } else {
        out << std::get<SpecificSolution>(solution);
    }
    return out;
}